

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool GetCScript(SigningProvider *provider,SignatureData *sigdata,CScriptID *scriptid,CScript *script
               )

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  CScript *in_RCX;
  CScriptID *in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 local_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RDX,in_RCX);
  if ((uVar3 & 1) == 0) {
    CScriptID::CScriptID(in_RDX,in_RCX);
    bVar2 = BaseHash<uint160>::operator==
                      ((BaseHash<uint160> *)in_RCX,
                       (BaseHash<uint160> *)
                       CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (bVar2) {
      CScript::operator=(in_RCX,(CScript *)
                                CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      local_31 = true;
    }
    else {
      CScriptID::CScriptID(in_RDX,in_RCX);
      bVar2 = BaseHash<uint160>::operator==
                        ((BaseHash<uint160> *)in_RCX,
                         (BaseHash<uint160> *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      if (bVar2) {
        CScript::operator=(in_RCX,(CScript *)
                                  CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
        local_31 = true;
      }
      else {
        local_31 = false;
      }
    }
  }
  else {
    local_31 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

static bool GetCScript(const SigningProvider& provider, const SignatureData& sigdata, const CScriptID& scriptid, CScript& script)
{
    if (provider.GetCScript(scriptid, script)) {
        return true;
    }
    // Look for scripts in SignatureData
    if (CScriptID(sigdata.redeem_script) == scriptid) {
        script = sigdata.redeem_script;
        return true;
    } else if (CScriptID(sigdata.witness_script) == scriptid) {
        script = sigdata.witness_script;
        return true;
    }
    return false;
}